

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isEndOfAttribute(TokenKind kind)

{
  int iVar1;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,kind);
  if ((((0x3e < iVar1 - 0xb2U) ||
       ((0x5080010000800001U >> ((ulong)(iVar1 - 0xb2U) & 0x3f) & 1) == 0)) && (1 < iVar1 - 0x14U))
     && (1 < iVar1 - 0x79U)) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isEndOfAttribute(TokenKind kind) {
    switch (kind) {
        case TokenKind::StarCloseParenthesis:
            // these indicate a missing *) somewhere
        case TokenKind::Semicolon:
        case TokenKind::PrimitiveKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::InterfaceKeyword:
        case TokenKind::PackageKeyword:
        case TokenKind::CheckerKeyword:
        case TokenKind::GenerateKeyword:
        case TokenKind::ModuleKeyword:
        case TokenKind::ClassKeyword:
            return true;
        default:
            return false;
    }
}